

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_string_length(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  float fVar1;
  int iVar2;
  lyxp_set *plVar3;
  ly_bool lVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  char *format;
  long lVar9;
  undefined4 uVar10;
  ly_ctx *ctx;
  ushort *puVar11;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      LVar5 = lyxp_set_cast(set,LYXP_SET_STRING);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      sVar6 = strlen((set->val).str);
    }
    else {
      LVar5 = lyxp_set_cast(*args,LYXP_SET_STRING);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      sVar6 = strlen(((*args)->val).str);
    }
    fVar1 = *(float *)(&DAT_001df948 + (ulong)((long)sVar6 < 0) * 4);
    lyxp_set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = (longdouble)(long)sVar6 + (longdouble)fVar1;
    return LY_SUCCESS;
  }
  if (arg_count == 0) {
    if (set->type != LYXP_SET_SCNODE_SET) goto LAB_001b797d;
    uVar8 = set->used;
    puVar11 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(set->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar11 = *(ushort **)((long)(set->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar11 == (ushort *)0x0) goto LAB_001b797d;
    if ((*puVar11 & 0xc) == 0) {
      ctx = set->ctx;
      pcVar7 = lys_nodetype2str(*puVar11);
      format = "Argument #0 of %s is a %s node \"%s\".";
    }
    else {
      lVar4 = warn_is_string_type(*(lysc_type **)(puVar11 + 0x30));
      if (lVar4 != '\0') goto LAB_001b797d;
      ctx = set->ctx;
      pcVar7 = *(char **)(puVar11 + 0x14);
      format = "Argument #0 of %s is node \"%s\", not of string-type.";
    }
  }
  else {
    plVar3 = *args;
    if (plVar3->type != LYXP_SET_SCNODE_SET) goto LAB_001b797d;
    uVar8 = plVar3->used;
    puVar11 = (ushort *)0x0;
    do {
      uVar8 = uVar8 - 1;
      if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
        puVar11 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar8 * 0x18);
        break;
      }
    } while (uVar8 != 0);
    if (puVar11 == (ushort *)0x0) goto LAB_001b797d;
    if ((*puVar11 & 0xc) == 0) {
      ctx = set->ctx;
      pcVar7 = lys_nodetype2str(*puVar11);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar4 = warn_is_string_type(*(lysc_type **)(puVar11 + 0x30));
      if (lVar4 != '\0') goto LAB_001b797d;
      ctx = set->ctx;
      pcVar7 = *(char **)(puVar11 + 0x14);
      format = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
  }
  ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_string_length",pcVar7);
LAB_001b797d:
  uVar8 = set->used;
  if ((ulong)uVar8 != 0) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar9);
      if (iVar2 == 2) {
        uVar10 = 1;
LAB_001b79ad:
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = uVar10;
      }
      else if (iVar2 == -2) {
        uVar10 = 0xffffffff;
        goto LAB_001b79ad;
      }
      lVar9 = lVar9 + 0x18;
    } while ((ulong)uVar8 * 0x18 != lVar9);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_string_length(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        rc = lyxp_set_cast(set, LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(set->val.str));
    }

    return LY_SUCCESS;
}